

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceDirWrapper.cpp
# Opt level: O2

QString * __thiscall
ResourceDirWrapper::getFieldName
          (QString *__return_storage_ptr__,ResourceDirWrapper *this,size_t fieldId)

{
  Executable *pEVar1;
  bool bVar2;
  PEFile *this_00;
  char *ch;
  
  switch(fieldId) {
  case 0:
    ch = "Characteristics";
    break;
  case 1:
    pEVar1 = (this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
             super_ExeElementWrapper.m_Exe;
    if (((pEVar1 == (Executable *)0x0) ||
        (this_00 = (PEFile *)__dynamic_cast(pEVar1,&Executable::typeinfo,&PEFile::typeinfo,0),
        this_00 == (PEFile *)0x0)) || (bVar2 = PEFile::isReproBuild(this_00), !bVar2)) {
      ch = "TimeDateStamp";
    }
    else {
      ch = "ReproChecksum";
    }
    break;
  case 2:
    ch = "MajorVersion";
    break;
  case 3:
    ch = "MinorVersion";
    break;
  case 4:
    ch = "NumberOfNamedEntries";
    break;
  case 5:
    ch = "NumberOfIdEntries";
    break;
  default:
    (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
      super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xe])
              (__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  QString::QString(__return_storage_ptr__,ch);
  return __return_storage_ptr__;
}

Assistant:

QString ResourceDirWrapper::getFieldName(size_t fieldId)
{
    switch (fieldId) {
        case CHARACTERISTIC: return "Characteristics";
        case TIMESTAMP: {
            PEFile* myPe = dynamic_cast<PEFile*>(this->m_Exe);
            if (myPe && myPe->isReproBuild()) {
                return "ReproChecksum";
            }
            return "TimeDateStamp";
        }
        case MAJOR_VER: return "MajorVersion";
        case MINOR_VER: return "MinorVersion";
        case NAMED_ENTRIES_NUM : return "NumberOfNamedEntries";
        case ID_ENTRIES_NUM : return "NumberOfIdEntries";
    }
    return getName();
}